

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O3

void __thiscall
cfd::core::AbstractTransaction::SetScriptWitnessStack
          (AbstractTransaction *this,uint32_t tx_in_index,uint32_t witness_index,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  void *pvVar1;
  wally_tx_witness_stack *stack;
  uchar *witness;
  CfdException *this_00;
  uchar *witness_len;
  undefined4 in_register_00000034;
  int ret;
  string function_name;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 local_50 [32];
  
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x1e9,"SetScriptWitnessStack");
  pvVar1 = this->wally_tx_pointer_;
  if (*(ulong *)((long)pvVar1 + 0x10) <= (ulong)tx_in_index) {
    return;
  }
  local_74 = -2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"wally witness is NULL.","")
  ;
  stack = *(wally_tx_witness_stack **)
           (*(long *)((long)pvVar1 + 8) + 0x38 + (ulong)tx_in_index * 0xd0);
  if (stack != (wally_tx_witness_stack *)0x0) {
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_70,0,(char *)local_70._M_string_length,0x5d6453);
    witness = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    witness_len = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish + -(long)witness;
    if (witness_len == (uchar *)0x0) {
      witness_len = (uchar *)0x0;
      witness = (uchar *)0x0;
    }
    local_74 = wally_tx_witness_stack_set(stack,(ulong)witness_index,witness,(size_t)witness_len);
    if (local_74 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p == &local_70.field_2) {
        return;
      }
      operator_delete(local_70._M_dataplus._M_p);
      return;
    }
  }
  local_50._0_8_ = "cfdcore_transaction_common.cpp";
  local_50._8_4_ = 0x201;
  local_50._16_8_ = "SetScriptWitnessStack";
  logger::log<std::__cxx11::string&,int&>
            ((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"{} NG[{}].",&local_70,&local_74);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = local_50 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"witness stack set error.","");
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void AbstractTransaction::SetScriptWitnessStack(
    uint32_t tx_in_index, uint32_t witness_index,
    const std::vector<uint8_t> &data) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    int ret = WALLY_EINVAL;
    struct wally_tx_witness_stack *stack_pointer = NULL;

    std::string function_name = "wally witness is NULL.";
    if (tx_pointer->inputs[tx_in_index].witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;

      // append witness stack
      function_name = "wally_tx_witness_stack_set";
      if (data.empty()) {
        ret =
            wally_tx_witness_stack_set(stack_pointer, witness_index, NULL, 0);
      } else {
        ret = wally_tx_witness_stack_set(
            stack_pointer, witness_index, data.data(), data.size());
      }
    }

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "{} NG[{}].", function_name, ret);
      throw CfdException(kCfdIllegalStateError, "witness stack set error.");
    }
  }
}